

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O1

JL_STATUS UnmarshalObject(JlDataObject *Object,JlMarshallElement *Description,
                         _Bool IgnoreExistingValuesInStruct,void *Output,size_t *pErrorAtPos)

{
  JL_DATA_TYPE JVar1;
  ulong __n;
  JL_STATUS JVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uint8_t *OutputU8;
  char *local_40;
  char *local_38;
  
  JVar1 = Description->Type;
  if (JVar1 == JL_DATA_TYPE_STRING) {
    if (Description->FieldSize == 0) {
      local_40 = (char *)0x0;
      if ((!IgnoreExistingValuesInStruct) && (*Output != (void *)0x0)) {
        WjTestLib_Free(*Output);
        *(undefined8 *)Output = 0;
      }
      JVar2 = JlGetObjectString(Object,&local_40);
      if ((JVar2 == JL_STATUS_SUCCESS) && (JVar2 = JL_STATUS_SUCCESS, local_40 != (char *)0x0)) {
        pcVar4 = JlStrDup(local_40);
        if (pcVar4 == (char *)0x0) {
          JVar2 = JL_STATUS_OUT_OF_MEMORY;
        }
        else {
          *(char **)Output = pcVar4;
        }
      }
      goto switchD_0011cf12_caseD_3;
    }
    __n = Description->FieldSize;
    if (__n == 0) goto LAB_0011cebc;
    local_40 = (char *)0x0;
    memset(Output,0,__n);
    JVar2 = JlGetObjectString(Object,&local_40);
    if (JVar2 != JL_STATUS_SUCCESS) goto switchD_0011cf12_caseD_3;
    if (local_40 == (char *)0x0) {
      JVar2 = JL_STATUS_SUCCESS;
      memset(Output,0,__n);
      goto switchD_0011cf12_caseD_3;
    }
    if (Output == (void *)0x0) {
      JVar2 = JL_STATUS_INVALID_PARAMETER;
      goto switchD_0011cf12_caseD_3;
    }
    local_38 = local_40;
    sVar3 = strlen(local_40);
    JVar2 = JL_STATUS_BUFFER_TOO_SMALL;
    if (__n <= sVar3) goto switchD_0011cf12_caseD_3;
    strcpy((char *)Output,local_38);
    goto LAB_0011d16f;
  }
LAB_0011cebc:
  if (JVar1 == JL_DATA_TYPE_NUMBER) {
    if (Description->NumberType != JL_NUM_TYPE_UNSIGNED) {
      if (Description->NumberType == JL_NUM_TYPE_SIGNED) {
        sVar5 = Description->FieldSize;
        local_40 = (char *)0x0;
        JVar2 = JlGetObjectNumberS64(Object,(int64_t *)&local_40);
        if (JVar2 != JL_STATUS_SUCCESS) goto switchD_0011cf12_caseD_3;
        JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        switch(sVar5) {
        case 1:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(char)local_40 != local_40) goto switchD_0011cf12_caseD_3;
          break;
        case 2:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(short)local_40 != local_40) goto switchD_0011cf12_caseD_3;
          goto LAB_0011d16a;
        default:
          goto switchD_0011cf12_caseD_3;
        case 4:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(int)local_40 != local_40) goto switchD_0011cf12_caseD_3;
          goto LAB_0011d114;
        case 8:
          goto switchD_0011cf12_caseD_8;
        }
LAB_0011cf2a:
        *(char *)Output = (char)local_40;
        goto LAB_0011d16f;
      }
      if (Description->NumberType == JL_NUM_TYPE_FLOAT) {
        sVar5 = Description->FieldSize;
        local_40 = (char *)0x0;
        JVar2 = JlGetObjectNumberF64(Object,(double *)&local_40);
        if (JVar2 != JL_STATUS_SUCCESS) goto switchD_0011cf12_caseD_3;
        if (sVar5 == 4) {
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((3.4028234663852886e+38 < (double)local_40) ||
             ((double)local_40 < 1.1754943508222875e-38)) goto switchD_0011cf12_caseD_3;
          *(float *)Output = (float)(double)local_40;
        }
        else {
          JVar2 = JL_STATUS_INVALID_SPECIFICATION;
          if (sVar5 != 8) goto switchD_0011cf12_caseD_3;
          *(char **)Output = local_40;
        }
        goto LAB_0011d16f;
      }
      goto LAB_0011d05c;
    }
    sVar5 = Description->FieldSize;
    local_40 = (char *)0x0;
    JVar2 = JlGetObjectNumberU64(Object,(uint64_t *)&local_40);
    if (JVar2 != JL_STATUS_SUCCESS) goto switchD_0011cf12_caseD_3;
    JVar2 = JL_STATUS_INVALID_SPECIFICATION;
    switch(sVar5) {
    case 1:
      JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
      if ((char *)0xff < local_40) goto switchD_0011cf12_caseD_3;
      goto LAB_0011cf2a;
    case 2:
      JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
      if ((char *)0xffff < local_40) goto switchD_0011cf12_caseD_3;
LAB_0011d16a:
      *(short *)Output = (short)local_40;
      break;
    default:
      goto switchD_0011cf12_caseD_3;
    case 4:
      JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
      if ((ulong)local_40 >> 0x20 != 0) goto switchD_0011cf12_caseD_3;
LAB_0011d114:
      *(int *)Output = (int)local_40;
      break;
    case 8:
switchD_0011cf12_caseD_8:
      pcVar4 = local_40;
LAB_0011d14a:
      *(char **)Output = pcVar4;
    }
  }
  else {
LAB_0011d05c:
    if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
      JVar2 = UnmarshallDictionary
                        (Object,Description->ChildStructDescription,
                         (ulong)Description->ChildStructDescriptionCount,
                         IgnoreExistingValuesInStruct,Output,pErrorAtPos);
      goto switchD_0011cf12_caseD_3;
    }
    JVar2 = JL_STATUS_INVALID_TYPE;
    if (JVar1 != JL_DATA_TYPE_BOOL) goto switchD_0011cf12_caseD_3;
    sVar5 = Description->FieldSize;
    local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
    JVar2 = JlGetObjectBool(Object,(_Bool *)&local_40);
    if (JVar2 != JL_STATUS_SUCCESS) goto switchD_0011cf12_caseD_3;
    JVar2 = JL_STATUS_INVALID_SPECIFICATION;
    switch(sVar5) {
    case 1:
      *(byte *)Output = (byte)local_40;
      break;
    case 2:
      *(ushort *)Output = (ushort)(byte)local_40;
      break;
    default:
      goto switchD_0011cf12_caseD_3;
    case 4:
      *(uint *)Output = (uint)(byte)local_40;
      break;
    case 8:
      pcVar4 = (char *)((ulong)local_40 & 0xff);
      goto LAB_0011d14a;
    }
  }
LAB_0011d16f:
  JVar2 = JL_STATUS_SUCCESS;
switchD_0011cf12_caseD_3:
  if (((JVar2 != JL_STATUS_SUCCESS) && (pErrorAtPos != (size_t *)0x0)) &&
     (Description->Type != JL_DATA_TYPE_DICTIONARY)) {
    sVar5 = JlGetObjectTag(Object);
    *pErrorAtPos = sVar5;
  }
  return JVar2;
}

Assistant:

static
JL_STATUS
    UnmarshalObject
    (
        JlDataObject const*         Object,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if( JL_DATA_TYPE_STRING == Description->Type  &&  0 == Description->FieldSize )
    {
        // Regular allocated string.
        // Output is a pointer to a string.
        jlStatus = UnmarshalString( Object, IgnoreExistingValuesInStruct, Output );
    }
    else if( JL_DATA_TYPE_STRING == Description->Type  &&  Description->FieldSize > 0 )
    {
        // Special case: This is a fixed size string in a structure
        jlStatus = UnmarshalStringFixed( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_UNSIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalUnsigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_SIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalSigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_FLOAT == Description->NumberType )
    {
        jlStatus = UnmarshalFloat( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = UnmarshalBool( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        jlStatus = UnmarshallDictionary(
            Object,
            Description->ChildStructDescription, Description->ChildStructDescriptionCount,
            IgnoreExistingValuesInStruct,
            Output,
            pErrorAtPos );
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  JL_DATA_TYPE_DICTIONARY != Description->Type
        &&  NULL != pErrorAtPos )
    {
        *pErrorAtPos = JlGetObjectTag( Object );
    }

    return jlStatus;
}